

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O2

void anon_unknown.dwarf_b513::verifyPixelsAreEqual<half>
               (FlatImageChannel *c1,FlatImageChannel *c2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  ImageLevel *pIVar5;
  TypedFlatImageChannel<half> *this;
  TypedFlatImageChannel<half> *this_00;
  half *phVar6;
  ArgExc *this_01;
  int x;
  int y;
  
  this = (TypedFlatImageChannel<half> *)
         __dynamic_cast(c1,&Imf_2_5::FlatImageChannel::typeinfo,
                        &Imf_2_5::TypedFlatImageChannel<half>::typeinfo,0);
  if ((this == (TypedFlatImageChannel<half> *)0x0) ||
     (this_00 = (TypedFlatImageChannel<half> *)
                __dynamic_cast(c2,&Imf_2_5::FlatImageChannel::typeinfo,
                               &Imf_2_5::TypedFlatImageChannel<half>::typeinfo,0),
     this_00 == (TypedFlatImageChannel<half> *)0x0)) {
    __cxa_bad_cast();
  }
  pIVar5 = (c1->super_ImageChannel)._level;
  iVar3 = (c1->super_ImageChannel)._xSampling;
  iVar4 = (c1->super_ImageChannel)._ySampling;
  y = (pIVar5->_dataWindow).min.y;
  do {
    if ((pIVar5->_dataWindow).max.y < y) {
      return;
    }
    x = (pIVar5->_dataWindow).min.x;
    while (x <= (pIVar5->_dataWindow).max.x) {
      phVar6 = Imf_2_5::TypedFlatImageChannel<half>::at(this,x,y);
      fVar2 = *(float *)((long)&half::_toFloat + (ulong)phVar6->_h * 4);
      phVar6 = Imf_2_5::TypedFlatImageChannel<half>::at(this_00,dx + x,dy + y);
      x = x + iVar3;
      pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar6->_h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(this_01,"different pixel values");
        __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    y = y + iVar4;
  } while( true );
}

Assistant:

void
verifyPixelsAreEqual
    (const FlatImageChannel &c1,
     const FlatImageChannel &c2,
     int dx,
     int dy)
{
    const TypedFlatImageChannel<T> &tc1 =
        dynamic_cast <const TypedFlatImageChannel<T>&> (c1);

    const TypedFlatImageChannel<T> &tc2 =
        dynamic_cast <const TypedFlatImageChannel<T>&> (c2);

    const Box2i &dataWindow = c1.level().dataWindow();
    int xStep = c1.xSampling();
    int yStep = c1.ySampling();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += yStep)
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; x += xStep)
            if (tc1.at (x, y) != tc2.at (x + dx, y + dy))
                throw ArgExc ("different pixel values");
}